

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UChar * ures_getString_63(UResourceBundle *resB,int32_t *len,UErrorCode *status)

{
  UBool UVar1;
  UChar *s;
  UErrorCode *status_local;
  int32_t *len_local;
  UResourceBundle *resB_local;
  
  if ((status == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    resB_local = (UResourceBundle *)0x0;
  }
  else if (resB == (UResourceBundle *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    resB_local = (UResourceBundle *)0x0;
  }
  else {
    resB_local = (UResourceBundle *)res_getString_63(&resB->fResData,resB->fRes,len);
    if (resB_local == (UResourceBundle *)0x0) {
      *status = U_RESOURCE_TYPE_MISMATCH;
    }
  }
  return (UChar *)resB_local;
}

Assistant:

U_CAPI const UChar* U_EXPORT2 ures_getString(const UResourceBundle* resB, int32_t* len, UErrorCode* status) {
    const UChar *s;
    if (status==NULL || U_FAILURE(*status)) {
        return NULL;
    }
    if(resB == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }
    s = res_getString(&(resB->fResData), resB->fRes, len);
    if (s == NULL) {
        *status = U_RESOURCE_TYPE_MISMATCH;
    }
    return s;
}